

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

Expr * __thiscall nivalis::Expr::diff(Expr *this,uint64_t var_addr,Environment *env)

{
  undefined1 uVar1;
  reference pvVar2;
  Expr *in_RSI;
  Expr *in_RDI;
  Differentiator diff;
  Expr *dexpr;
  uint32_t in_stack_00000f5c;
  ASTNode **in_stack_00000f60;
  Differentiator *in_stack_00000f68;
  undefined7 in_stack_fffffffffffffe40;
  Expr *this_00;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_fffffffffffffe60
  ;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_fffffffffffffe90
  ;
  Environment *in_stack_fffffffffffffe98;
  uint64_t in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  Differentiator *in_stack_fffffffffffffeb0;
  
  this_00 = in_RDI;
  Expr(in_RSI);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::clear
            ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)0x2d4bb8);
  anon_unknown_3::Differentiator::Differentiator
            (in_stack_fffffffffffffeb0,
             (AST *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  uVar1 = anon_unknown_3::Differentiator::diff
                    (in_stack_00000f68,in_stack_00000f60,in_stack_00000f5c);
  if ((bool)uVar1) {
    optimize((Expr *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  }
  else {
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
              (in_stack_fffffffffffffe60,(size_type)this_00);
    pvVar2 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
             operator[](&this_00->ast,0);
    pvVar2->opcode = 0;
  }
  anon_unknown_3::Differentiator::~Differentiator
            ((Differentiator *)CONCAT17(uVar1,in_stack_fffffffffffffe40));
  return in_RDI;
}

Assistant:

Expr Expr::diff(uint64_t var_addr, Environment& env) const {
    Expr dexpr;
    dexpr.ast.clear();

    Differentiator diff(ast, var_addr, env, dexpr.ast);
    if (!diff.diff()) {
        dexpr.ast.resize(1);
        dexpr.ast[0].opcode = OpCode::null;
    } else {
        dexpr.optimize();
    }
    return dexpr;
}